

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O0

bool __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
          (WriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  uchar *__s1;
  reference this_00;
  size_type __n;
  byte bVar4;
  uint uVar5;
  size_t __n_00;
  long lVar6;
  ulong uVar7;
  uint *in_RSI;
  uint *in_RDI;
  ktx_uint32_t row;
  ktx_uint8_t *pImage;
  ktx_uint32_t faceSlice;
  ktx_uint32_t layer;
  ktx_size_t expectedFaceLodSize;
  ktx_size_t rowBytes;
  ktx_size_t paddedRowBytes;
  ktx_size_t paddedImageBytes;
  ktx_uint32_t rowPadding;
  ktx_uint32_t numImages;
  ktx_uint32_t levelDepth;
  ktx_uint32_t levelHeight;
  ktx_uint32_t levelWidth;
  ktx_uint32_t faceLodSize;
  ktx_uint32_t level;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_6c;
  uchar *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  uint local_30;
  uint local_1c;
  uint *local_18;
  
  local_1c = 0;
  local_18 = in_RSI;
  while( true ) {
    if (*in_RDI <= local_1c) {
      return true;
    }
    bVar4 = (byte)local_1c;
    if (in_RDI[3] >> (bVar4 & 0x1f) == 0) {
      local_7c = 1;
    }
    else {
      local_7c = in_RDI[3] >> (bVar4 & 0x1f);
    }
    if (in_RDI[4] >> (bVar4 & 0x1f) == 0) {
      local_80 = 1;
    }
    else {
      local_80 = in_RDI[4] >> (bVar4 & 0x1f);
    }
    if (in_RDI[5] >> (bVar4 & 0x1f) == 0) {
      local_84 = 1;
    }
    else {
      local_84 = in_RDI[5] >> (bVar4 & 0x1f);
    }
    __n_00 = (ulong)local_7c * 3;
    uVar5 = 3 - ((int)__n_00 + 3U & 3);
    lVar6 = __n_00 + uVar5;
    uVar7 = lVar6 * (ulong)local_80;
    if ((in_RDI[2] == 6) && ((in_RDI[6] & 1) == 0)) {
      local_30 = in_RDI[2];
      local_58 = uVar7;
    }
    else {
      if (in_RDI[2] == 6) {
        local_88 = in_RDI[2];
      }
      else {
        local_88 = local_84;
      }
      local_30 = local_88;
      local_58 = uVar7 * local_88 * (ulong)in_RDI[1];
    }
    if (*local_18 != local_58) break;
    local_18 = local_18 + 1;
    for (local_5c = 0; local_5c < in_RDI[1]; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
        if (uVar5 == 0) {
          pvVar2 = std::
                   vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                 *)(in_RDI + 0x30),(ulong)local_1c);
          pvVar3 = std::
                   vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator[](pvVar2,(ulong)local_5c);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[](pvVar3,(ulong)local_60);
          __s1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1702ed);
          pvVar2 = std::
                   vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                 *)(in_RDI + 0x30),(ulong)local_1c);
          pvVar3 = std::
                   vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator[](pvVar2,(ulong)local_5c);
          this_00 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[](pvVar3,(ulong)local_60);
          __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
          iVar1 = memcmp(__s1,local_18,__n);
          if (iVar1 != 0) {
            return false;
          }
          local_18 = (uint *)(uVar7 + (long)local_18);
        }
        else {
          pvVar2 = std::
                   vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                 *)(in_RDI + 0x30),(ulong)local_1c);
          pvVar3 = std::
                   vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator[](pvVar2,(ulong)local_5c);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[](pvVar3,(ulong)local_60);
          local_68 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1703b5);
          for (local_6c = 0; local_6c < local_80; local_6c = local_6c + 1) {
            iVar1 = memcmp(local_68,local_18,__n_00);
            if (iVar1 != 0) {
              return false;
            }
            local_68 = local_68 + __n_00;
            local_18 = (uint *)(lVar6 + (long)local_18);
          }
        }
      }
    }
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool compareRawImages(ktx_uint8_t* pData) {
        for (ktx_uint32_t level = 0; level < numLevels; level++) {
            ktx_uint32_t faceLodSize = *(ktx_uint32_t*)pData;
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            ktx_uint32_t numImages;
            ktx_uint32_t rowPadding;
            ktx_size_t paddedImageBytes;
            ktx_size_t paddedRowBytes, rowBytes;
            ktx_size_t expectedFaceLodSize;

            rowBytes = levelWidth
                            * sizeof(component_type)
                            * numComponents;
            rowPadding = 3 - ((rowBytes + KTX_GL_UNPACK_ALIGNMENT-1) % KTX_GL_UNPACK_ALIGNMENT);
            paddedRowBytes = rowBytes + rowPadding;
            paddedImageBytes = paddedRowBytes * levelHeight;
            if (numFaces == 6 && !isArray) {
                // Non-array cubemap.
                numImages = numFaces;
                expectedFaceLodSize = paddedImageBytes;
            } else {
                numImages = numFaces == 6 ? numFaces : levelDepth;
                expectedFaceLodSize = paddedImageBytes * numImages * numLayers;
            }
            if (faceLodSize != expectedFaceLodSize)
               return false;
            pData += sizeof(ktx_uint32_t);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(),
                                   pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += paddedRowBytes;
                        }
                    }
                }
            }
        }
        return true;
    }